

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  char *hg_log [8];
  string range;
  OutputLogger err;
  LogParser out;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).OldRevision,":");
  std::operator+(&range,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&out);
  hg_log[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  hg_log[1] = "log";
  hg_log[2] = "--removed";
  hg_log[3] = "-r";
  hg_log[4] = range._M_dataplus._M_p;
  hg_log[5] = "--template";
  hg_log[6] = 
  "<logentry\n   revision=\"{node|short}\">\n  <author>{author|person}</author>\n  <email>{author|email}</email>\n  <date>{date|isodate}</date>\n  <msg>{desc}</msg>\n  <files>{files}</files>\n  <file_adds>{file_adds}</file_adds>\n  <file_dels>{file_dels}</file_dels>\n</logentry>\n"
  ;
  hg_log[7] = (char *)0x0;
  LogParser::LogParser(&out,this,"log-out> ");
  cmProcessTools::OutputParser::Process((OutputParser *)&out,"<?xml version=\"1.0\"?>\n<log>\n");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,hg_log,(OutputParser *)&out,(OutputParser *)&err,(char *)0x0
                      ,Auto);
  cmProcessTools::OutputParser::Process((OutputParser *)&out,"</log>\n");
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  LogParser::~LogParser(&out);
  std::__cxx11::string::~string((string *)&range);
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  const char* hg = this->CommandLineTool.c_str();
  const char* hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  const char* hg_log[] = {
    hg,           "log",         "--removed", "-r", range.c_str(),
    "--template", hgXMLTemplate, CM_NULLPTR
  };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}